

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.hpp
# Opt level: O1

void re::math::normalize<float,256l,256l>(span<const_float,_256L> in,span<float,_256L> out)

{
  float fVar1;
  long lVar2;
  float fVar3;
  
  fVar3 = 0.0;
  lVar2 = 0;
  do {
    fVar1 = *(float *)((long)in.storage_.data_ + lVar2 * 4);
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar3 = fVar1 + fVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  if (0.0 <= fVar3) {
    lVar2 = 0;
    do {
      *(float *)((long)out.storage_.data_ + lVar2 * 4) =
           *(float *)((long)in.storage_.data_ + lVar2 * 4) / fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    return;
  }
  __assert_fail("sum >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                ,0x1a,
                "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = 256L, N_out = 256L]"
               );
}

Assistant:

void
normalize(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    assert(std::size(in) == std::size(out));
    auto sum = std::accumulate(
        std::cbegin(in),
        std::cend(in),
        static_cast<T>(0),
        [] (const auto result, const auto value) {
            return result + std::fmax(value, 0);
        }
    );

    assert(sum >= 0);
    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::begin(out),
        [sum] (auto v) {
            return v / sum;
        }
    );
}